

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAmount.cpp
# Opt level: O0

void __thiscall jbcoin::STAmount::STAmount(STAmount *this,uint64_t mantissa,bool negative)

{
  byte local_39;
  bool negative_local;
  uint64_t mantissa_local;
  STAmount *this_local;
  
  STBase::STBase(&this->super_STBase);
  (this->super_STBase)._vptr_STBase = (_func_int **)&PTR__STAmount_00519e68;
  Issue::Issue(&this->mIssue);
  this->mValue = mantissa;
  this->mOffset = 0;
  this->mIsNative = true;
  local_39 = 0;
  if (mantissa != 0) {
    local_39 = negative;
  }
  this->mIsNegative = (bool)(local_39 & 1);
  return;
}

Assistant:

STAmount::STAmount (std::uint64_t mantissa, bool negative)
    : mValue (mantissa)
    , mOffset (0)
    , mIsNative (true)
    , mIsNegative (mantissa != 0 && negative)
{
}